

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_panning_slide(xm_channel_context_t *ch,uint8_t rawval)

{
  float f;
  uint8_t rawval_local;
  xm_channel_context_t *ch_local;
  
  if (((rawval & 0xf0) == 0) || ((rawval & 0xf) == 0)) {
    if ((rawval & 0xf0) == 0) {
      ch->panning = ch->panning - (float)(rawval & 0xf) / 255.0;
      if (ch->panning <= 0.0 && ch->panning != 0.0) {
        ch->panning = 0.0;
      }
    }
    else {
      ch->panning = (float)((int)(uint)rawval >> 4) / 255.0 + ch->panning;
      if (1.0 < ch->panning) {
        ch->panning = 1.0;
      }
    }
  }
  return;
}

Assistant:

static void xm_panning_slide(xm_channel_context_t* ch, uint8_t rawval) {
	float f;

	if((rawval & 0xF0) && (rawval & 0x0F)) {
		/* Illegal state */
		return;
	}

	if(rawval & 0xF0) {
		/* Slide right */
		f = (float)(rawval >> 4) / (float)0xFF;
		ch->panning += f;
		XM_CLAMP_UP(ch->panning);
	} else {
		/* Slide left */
		f = (float)(rawval & 0x0F) / (float)0xFF;
		ch->panning -= f;
		XM_CLAMP_DOWN(ch->panning);
	}
}